

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_command_queue_flag_t flags)

{
  char *pcVar1;
  string local_30;
  
  if (flags == ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32) {
    pcVar1 = "ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32";
  }
  else if (flags == ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY) {
    pcVar1 = "ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY";
  }
  else {
    if (flags != 0) {
      std::__cxx11::to_string(&local_30,flags);
      std::operator+(__return_storage_ptr__,"Unknown ze_command_queue_flag_t value: ",&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    pcVar1 = "Default";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,(allocator *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_command_queue_flag_t flags) {
  if (flags == 0) {
    return "Default";
  } else if (flags == ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY) {
    return "ZE_COMMAND_QUEUE_FLAG_EXPLICIT_ONLY";
  } else if (flags == ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32) {
    return "ZE_COMMAND_QUEUE_FLAG_FORCE_UINT32";
  } else {
    return "Unknown ze_command_queue_flag_t value: " +
           std::to_string(static_cast<int>(flags));
  }
}